

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EdgeSensitivePathSuffixSyntax *pEVar1;
  Token *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_00000008;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  ExpressionSyntax *in_stack_ffffffffffffff90;
  
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  deepClone<slang::syntax::NameSyntax>(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9460d8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EdgeSensitivePathSuffixSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,(ExpressionSyntax *)__child_stack,in_stack_00000030);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EdgeSensitivePathSuffixSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EdgeSensitivePathSuffixSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.outputs, alloc),
        node.polarityOperator.deepClone(alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}